

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodeframe.c
# Opt level: O2

void av1_read_timing_info_header
               (aom_timing_info_t *timing_info,aom_internal_error_info *error,
               aom_read_bit_buffer *rb)

{
  uint32_t uVar1;
  int iVar2;
  
  uVar1 = aom_rb_read_unsigned_literal(rb,0x20);
  timing_info->num_units_in_display_tick = uVar1;
  uVar1 = aom_rb_read_unsigned_literal(rb,0x20);
  timing_info->time_scale = uVar1;
  if (uVar1 == 0 || timing_info->num_units_in_display_tick == 0) {
    aom_internal_error(error,AOM_CODEC_UNSUP_BITSTREAM,
                       "num_units_in_display_tick and time_scale must be greater than 0.");
  }
  iVar2 = aom_rb_read_bit(rb);
  timing_info->equal_picture_interval = iVar2;
  if (iVar2 != 0) {
    uVar1 = aom_rb_read_uvlc(rb);
    if (uVar1 == 0xffffffff) {
      aom_internal_error(error,AOM_CODEC_UNSUP_BITSTREAM,
                         "num_ticks_per_picture_minus_1 cannot be (1 << 32) - 1.");
    }
    timing_info->num_ticks_per_picture = uVar1 + 1;
  }
  return;
}

Assistant:

void av1_read_timing_info_header(aom_timing_info_t *timing_info,
                                 struct aom_internal_error_info *error,
                                 struct aom_read_bit_buffer *rb) {
  timing_info->num_units_in_display_tick =
      aom_rb_read_unsigned_literal(rb,
                                   32);  // Number of units in a display tick
  timing_info->time_scale = aom_rb_read_unsigned_literal(rb, 32);  // Time scale
  if (timing_info->num_units_in_display_tick == 0 ||
      timing_info->time_scale == 0) {
    aom_internal_error(
        error, AOM_CODEC_UNSUP_BITSTREAM,
        "num_units_in_display_tick and time_scale must be greater than 0.");
  }
  timing_info->equal_picture_interval =
      aom_rb_read_bit(rb);  // Equal picture interval bit
  if (timing_info->equal_picture_interval) {
    const uint32_t num_ticks_per_picture_minus_1 = aom_rb_read_uvlc(rb);
    if (num_ticks_per_picture_minus_1 == UINT32_MAX) {
      aom_internal_error(
          error, AOM_CODEC_UNSUP_BITSTREAM,
          "num_ticks_per_picture_minus_1 cannot be (1 << 32) - 1.");
    }
    timing_info->num_ticks_per_picture = num_ticks_per_picture_minus_1 + 1;
  }
}